

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  Geometry *pGVar9;
  RTCIntersectArguments *pRVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [32];
  int iVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong unaff_R13;
  size_t mask;
  ulong uVar25;
  ulong uVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined4 uVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar66 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_b84;
  ulong local_b80;
  ulong local_b78;
  ulong *local_b70;
  ulong local_b68;
  ulong local_b60;
  ulong local_b58;
  undefined1 local_b50 [16];
  undefined1 local_b40 [16];
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  float local_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  Ray *local_b00;
  RayQueryContext *local_af8;
  ulong local_af0;
  Scene *local_ae8;
  undefined4 local_ae0;
  undefined4 local_adc;
  undefined4 local_ad8;
  undefined4 local_ad4;
  undefined4 local_ad0;
  undefined4 local_acc;
  uint local_ac8;
  uint local_ac4;
  uint local_ac0;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  byte local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  ulong local_800 [250];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar67 = ray->tfar;
    if (0.0 <= fVar67) {
      local_b70 = local_800 + 1;
      aVar8 = (ray->dir).field_0;
      auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar28._8_4_ = 0x7fffffff;
      auVar28._0_8_ = 0x7fffffff7fffffff;
      auVar28._12_4_ = 0x7fffffff;
      auVar28 = vandps_avx512vl((undefined1  [16])aVar8,auVar28);
      auVar29._8_4_ = 0x219392ef;
      auVar29._0_8_ = 0x219392ef219392ef;
      auVar29._12_4_ = 0x219392ef;
      uVar24 = vcmpps_avx512vl(auVar28,auVar29,1);
      auVar62._8_4_ = 0x3f800000;
      auVar62._0_8_ = &DAT_3f8000003f800000;
      auVar62._12_4_ = 0x3f800000;
      local_800[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar28 = vdivps_avx(auVar62,(undefined1  [16])aVar8);
      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar27 = (bool)((byte)uVar24 & 1);
      auVar32._0_4_ = (uint)bVar27 * auVar29._0_4_ | (uint)!bVar27 * auVar28._0_4_;
      bVar27 = (bool)((byte)(uVar24 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar27 * auVar29._4_4_ | (uint)!bVar27 * auVar28._4_4_;
      bVar27 = (bool)((byte)(uVar24 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar27 * auVar29._8_4_ | (uint)!bVar27 * auVar28._8_4_;
      bVar27 = (bool)((byte)(uVar24 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar27 * auVar29._12_4_ | (uint)!bVar27 * auVar28._12_4_;
      auVar30._8_4_ = 0x3f7ffffa;
      auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar30._12_4_ = 0x3f7ffffa;
      auVar30 = vmulps_avx512vl(auVar32,auVar30);
      auVar31._8_4_ = 0x3f800003;
      auVar31._0_8_ = 0x3f8000033f800003;
      auVar31._12_4_ = 0x3f800003;
      auVar31 = vmulps_avx512vl(auVar32,auVar31);
      auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar73 = ZEXT1664(auVar28);
      auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar74 = ZEXT1664(auVar28);
      auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar75 = ZEXT1664(auVar28);
      auVar28 = vbroadcastss_avx512vl(auVar30);
      auVar76 = ZEXT1664(auVar28);
      auVar28 = vmovshdup_avx(auVar30);
      auVar29 = vshufps_avx512vl(auVar30,auVar30,0x55);
      auVar77 = ZEXT1664(auVar29);
      auVar29 = vshufpd_avx(auVar30,auVar30,1);
      auVar32 = vshufps_avx512vl(auVar30,auVar30,0xaa);
      auVar78 = ZEXT1664(auVar32);
      fVar58 = auVar31._0_4_;
      local_b20 = vshufps_avx(auVar31,auVar31,0x55);
      auVar70 = ZEXT1664(local_b20);
      local_b30 = vshufps_avx(auVar31,auVar31,0xaa);
      auVar72 = ZEXT1664(local_b30);
      local_b78 = (ulong)(auVar30._0_4_ < 0.0) << 4;
      local_b80 = (ulong)(auVar28._0_4_ < 0.0) << 4 | 0x20;
      uVar24 = (ulong)(auVar29._0_4_ < 0.0) << 4 | 0x40;
      local_b68 = local_b78 ^ 0x10;
      uVar25 = local_b80 ^ 0x10;
      uVar26 = uVar24 ^ 0x10;
      uVar61 = auVar33._0_4_;
      local_b40._4_4_ = uVar61;
      local_b40._0_4_ = uVar61;
      local_b40._8_4_ = uVar61;
      local_b40._12_4_ = uVar61;
      auVar63 = ZEXT1664(local_b40);
      local_b50._4_4_ = fVar67;
      local_b50._0_4_ = fVar67;
      local_b50._8_4_ = fVar67;
      local_b50._12_4_ = fVar67;
      auVar65 = ZEXT1664(local_b50);
      fVar67 = fVar58;
      fVar68 = fVar58;
      fVar69 = fVar58;
      local_b60 = uVar26;
      local_b58 = uVar25;
      local_b10 = fVar58;
      fStack_b0c = fVar58;
      fStack_b08 = fVar58;
      fStack_b04 = fVar58;
      do {
        if (local_b70 == local_800) {
          return;
        }
        uVar23 = local_b70[-1];
        local_b70 = local_b70 + -1;
        do {
          if ((uVar23 & 8) == 0) {
            auVar28 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + local_b78),
                                      auVar73._0_16_);
            auVar28 = vmulps_avx512vl(auVar76._0_16_,auVar28);
            auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + local_b80),
                                      auVar74._0_16_);
            auVar33 = vmulps_avx512vl(auVar77._0_16_,auVar33);
            auVar28 = vmaxps_avx(auVar28,auVar33);
            auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar24),auVar75._0_16_)
            ;
            auVar33 = vmulps_avx512vl(auVar78._0_16_,auVar33);
            auVar33 = vmaxps_avx(auVar33,auVar63._0_16_);
            auVar28 = vmaxps_avx(auVar28,auVar33);
            auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + local_b68),
                                      auVar73._0_16_);
            auVar57._0_4_ = fVar58 * auVar33._0_4_;
            auVar57._4_4_ = fVar67 * auVar33._4_4_;
            auVar57._8_4_ = fVar68 * auVar33._8_4_;
            auVar57._12_4_ = fVar69 * auVar33._12_4_;
            auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar25),auVar74._0_16_)
            ;
            auVar59._0_4_ = auVar70._0_4_ * auVar33._0_4_;
            auVar59._4_4_ = auVar70._4_4_ * auVar33._4_4_;
            auVar59._8_4_ = auVar70._8_4_ * auVar33._8_4_;
            auVar59._12_4_ = auVar70._12_4_ * auVar33._12_4_;
            auVar33 = vminps_avx(auVar57,auVar59);
            auVar29 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar23 + 0x20 + uVar26),auVar75._0_16_)
            ;
            auVar60._0_4_ = auVar72._0_4_ * auVar29._0_4_;
            auVar60._4_4_ = auVar72._4_4_ * auVar29._4_4_;
            auVar60._8_4_ = auVar72._8_4_ * auVar29._8_4_;
            auVar60._12_4_ = auVar72._12_4_ * auVar29._12_4_;
            auVar29 = vminps_avx(auVar60,auVar65._0_16_);
            auVar33 = vminps_avx(auVar33,auVar29);
            uVar12 = vcmpps_avx512vl(auVar28,auVar33,2);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),(uint)(byte)uVar12);
          }
          if ((uVar23 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar18 = 4;
            }
            else {
              uVar22 = uVar23 & 0xfffffffffffffff0;
              lVar21 = 0;
              for (uVar23 = unaff_R13; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
              {
                lVar21 = lVar21 + 1;
              }
              for (uVar19 = unaff_R13 - 1 & unaff_R13; uVar23 = *(ulong *)(uVar22 + lVar21 * 8),
                  uVar19 != 0; uVar19 = uVar19 - 1 & uVar19) {
                *local_b70 = uVar23;
                local_b70 = local_b70 + 1;
                lVar21 = 0;
                for (uVar23 = uVar19; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000)
                {
                  lVar21 = lVar21 + 1;
                }
              }
              iVar18 = 0;
            }
          }
          else {
            iVar18 = 6;
          }
        } while (iVar18 == 0);
        if (iVar18 == 6) {
          iVar18 = 0;
          local_af0 = (ulong)((uint)uVar23 & 0xf) - 8;
          bVar27 = local_af0 != 0;
          if (bVar27) {
            uVar23 = uVar23 & 0xfffffffffffffff0;
            uVar22 = 0;
            do {
              lVar20 = uVar22 * 0xe0;
              lVar21 = uVar23 + 0xd0 + lVar20;
              local_a00 = *(undefined8 *)(lVar21 + 0x10);
              uStack_9f8 = *(undefined8 *)(lVar21 + 0x18);
              lVar21 = uVar23 + 0xc0 + lVar20;
              local_9e0 = *(undefined8 *)(lVar21 + 0x10);
              uStack_9d8 = *(undefined8 *)(lVar21 + 0x18);
              uStack_9d0 = local_9e0;
              uStack_9c8 = uStack_9d8;
              uStack_9f0 = local_a00;
              uStack_9e8 = uStack_9f8;
              auVar56._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x60 + lVar20);
              auVar56._0_16_ = *(undefined1 (*) [16])(uVar23 + lVar20);
              auVar36._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x70 + lVar20);
              auVar36._0_16_ = *(undefined1 (*) [16])(uVar23 + 0x10 + lVar20);
              auVar37._16_16_ = *(undefined1 (*) [16])(uVar23 + 0x80 + lVar20);
              auVar37._0_16_ = *(undefined1 (*) [16])(uVar23 + 0x20 + lVar20);
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0x30 + lVar20);
              auVar40._16_16_ = auVar28;
              auVar40._0_16_ = auVar28;
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0x40 + lVar20);
              auVar41._16_16_ = auVar28;
              auVar41._0_16_ = auVar28;
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0x50 + lVar20);
              auVar42._16_16_ = auVar28;
              auVar42._0_16_ = auVar28;
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0x90 + lVar20);
              auVar43._16_16_ = auVar28;
              auVar43._0_16_ = auVar28;
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0xa0 + lVar20);
              auVar44._16_16_ = auVar28;
              auVar44._0_16_ = auVar28;
              auVar28 = *(undefined1 (*) [16])(uVar23 + 0xb0 + lVar20);
              auVar45._16_16_ = auVar28;
              auVar45._0_16_ = auVar28;
              uVar61 = *(undefined4 *)&(ray->org).field_0;
              auVar46._4_4_ = uVar61;
              auVar46._0_4_ = uVar61;
              auVar46._8_4_ = uVar61;
              auVar46._12_4_ = uVar61;
              auVar46._16_4_ = uVar61;
              auVar46._20_4_ = uVar61;
              auVar46._24_4_ = uVar61;
              auVar46._28_4_ = uVar61;
              auVar34 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
              auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
              uVar61 = *(undefined4 *)&(ray->dir).field_0;
              auVar64._4_4_ = uVar61;
              auVar64._0_4_ = uVar61;
              auVar64._8_4_ = uVar61;
              auVar64._12_4_ = uVar61;
              auVar64._16_4_ = uVar61;
              auVar64._20_4_ = uVar61;
              auVar64._24_4_ = uVar61;
              auVar64._28_4_ = uVar61;
              uVar61 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
              auVar66._4_4_ = uVar61;
              auVar66._0_4_ = uVar61;
              auVar66._8_4_ = uVar61;
              auVar66._12_4_ = uVar61;
              auVar66._16_4_ = uVar61;
              auVar66._20_4_ = uVar61;
              auVar66._24_4_ = uVar61;
              auVar66._28_4_ = uVar61;
              fVar7 = (ray->dir).field_0.m128[2];
              auVar71._4_4_ = fVar7;
              auVar71._0_4_ = fVar7;
              auVar71._8_4_ = fVar7;
              auVar71._12_4_ = fVar7;
              auVar71._16_4_ = fVar7;
              auVar71._20_4_ = fVar7;
              auVar71._24_4_ = fVar7;
              auVar71._28_4_ = fVar7;
              auVar56 = vsubps_avx(auVar56,auVar46);
              auVar36 = vsubps_avx512vl(auVar36,auVar34);
              auVar37 = vsubps_avx512vl(auVar37,auVar35);
              auVar38 = vsubps_avx512vl(auVar40,auVar46);
              auVar39 = vsubps_avx512vl(auVar41,auVar34);
              auVar40 = vsubps_avx512vl(auVar42,auVar35);
              auVar41 = vsubps_avx512vl(auVar43,auVar46);
              auVar42 = vsubps_avx512vl(auVar44,auVar34);
              auVar35 = vsubps_avx512vl(auVar45,auVar35);
              auVar43 = vsubps_avx512vl(auVar41,auVar56);
              auVar44 = vsubps_avx512vl(auVar42,auVar36);
              auVar34 = vsubps_avx(auVar35,auVar37);
              auVar45 = vsubps_avx512vl(auVar56,auVar38);
              auVar46 = vsubps_avx512vl(auVar36,auVar39);
              auVar47 = vsubps_avx512vl(auVar37,auVar40);
              auVar48 = vsubps_avx512vl(auVar38,auVar41);
              auVar49 = vsubps_avx512vl(auVar39,auVar42);
              auVar50 = vsubps_avx512vl(auVar40,auVar35);
              auVar51 = vaddps_avx512vl(auVar41,auVar56);
              auVar52 = vaddps_avx512vl(auVar42,auVar36);
              auVar53 = vaddps_avx512vl(auVar35,auVar37);
              auVar54 = vmulps_avx512vl(auVar52,auVar34);
              auVar54 = vfmsub231ps_avx512vl(auVar54,auVar44,auVar53);
              auVar53 = vmulps_avx512vl(auVar53,auVar43);
              auVar55 = vfmsub231ps_avx512vl(auVar53,auVar34,auVar51);
              auVar53._4_4_ = auVar44._4_4_ * auVar51._4_4_;
              auVar53._0_4_ = auVar44._0_4_ * auVar51._0_4_;
              auVar53._8_4_ = auVar44._8_4_ * auVar51._8_4_;
              auVar53._12_4_ = auVar44._12_4_ * auVar51._12_4_;
              auVar53._16_4_ = auVar44._16_4_ * auVar51._16_4_;
              auVar53._20_4_ = auVar44._20_4_ * auVar51._20_4_;
              auVar53._24_4_ = auVar44._24_4_ * auVar51._24_4_;
              auVar53._28_4_ = auVar51._28_4_;
              auVar28 = vfmsub231ps_fma(auVar53,auVar43,auVar52);
              auVar52._0_4_ = fVar7 * auVar28._0_4_;
              auVar52._4_4_ = fVar7 * auVar28._4_4_;
              auVar52._8_4_ = fVar7 * auVar28._8_4_;
              auVar52._12_4_ = fVar7 * auVar28._12_4_;
              auVar52._16_4_ = fVar7 * 0.0;
              auVar52._20_4_ = fVar7 * 0.0;
              auVar52._24_4_ = fVar7 * 0.0;
              auVar52._28_4_ = 0;
              auVar53 = vfmadd231ps_avx512vl(auVar52,auVar66,auVar55);
              local_9c0 = vfmadd231ps_avx512vl(auVar53,auVar64,auVar54);
              auVar53 = vaddps_avx512vl(auVar56,auVar38);
              auVar51 = vaddps_avx512vl(auVar36,auVar39);
              auVar52 = vaddps_avx512vl(auVar37,auVar40);
              auVar54 = vmulps_avx512vl(auVar51,auVar47);
              auVar54 = vfmsub231ps_avx512vl(auVar54,auVar46,auVar52);
              auVar52 = vmulps_avx512vl(auVar52,auVar45);
              auVar52 = vfmsub231ps_avx512vl(auVar52,auVar47,auVar53);
              auVar53 = vmulps_avx512vl(auVar53,auVar46);
              auVar53 = vfmsub231ps_avx512vl(auVar53,auVar45,auVar51);
              auVar51._4_4_ = fVar7 * auVar53._4_4_;
              auVar51._0_4_ = fVar7 * auVar53._0_4_;
              auVar51._8_4_ = fVar7 * auVar53._8_4_;
              auVar51._12_4_ = fVar7 * auVar53._12_4_;
              auVar51._16_4_ = fVar7 * auVar53._16_4_;
              auVar51._20_4_ = fVar7 * auVar53._20_4_;
              auVar51._24_4_ = fVar7 * auVar53._24_4_;
              auVar51._28_4_ = auVar53._28_4_;
              auVar53 = vfmadd231ps_avx512vl(auVar51,auVar66,auVar52);
              local_9a0 = vfmadd231ps_avx512vl(auVar53,auVar64,auVar54);
              auVar38 = vaddps_avx512vl(auVar38,auVar41);
              auVar53 = vaddps_avx512vl(auVar39,auVar42);
              auVar35 = vaddps_avx512vl(auVar40,auVar35);
              auVar51 = vmulps_avx512vl(auVar53,auVar50);
              auVar51 = vfmsub231ps_avx512vl(auVar51,auVar49,auVar35);
              auVar39._4_4_ = auVar35._4_4_ * auVar48._4_4_;
              auVar39._0_4_ = auVar35._0_4_ * auVar48._0_4_;
              auVar39._8_4_ = auVar35._8_4_ * auVar48._8_4_;
              auVar39._12_4_ = auVar35._12_4_ * auVar48._12_4_;
              auVar39._16_4_ = auVar35._16_4_ * auVar48._16_4_;
              auVar39._20_4_ = auVar35._20_4_ * auVar48._20_4_;
              auVar39._24_4_ = auVar35._24_4_ * auVar48._24_4_;
              auVar39._28_4_ = auVar35._28_4_;
              auVar35 = vfmsub231ps_avx512vl(auVar39,auVar50,auVar38);
              auVar38 = vmulps_avx512vl(auVar38,auVar49);
              auVar38 = vfmsub231ps_avx512vl(auVar38,auVar48,auVar53);
              auVar38 = vmulps_avx512vl(auVar71,auVar38);
              auVar35 = vfmadd231ps_avx512vl(auVar38,auVar66,auVar35);
              auVar53 = vfmadd231ps_avx512vl(auVar35,auVar64,auVar51);
              auVar54._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
              auVar54._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
              auVar54._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
              auVar54._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
              auVar54._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
              auVar54._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
              auVar54._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
              auVar54._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
              local_980 = vaddps_avx512vl(auVar53,auVar54);
              local_a20 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              vandps_avx512vl(local_980,local_a20);
              auVar35._8_4_ = 0x34000000;
              auVar35._0_8_ = 0x3400000034000000;
              auVar35._12_4_ = 0x34000000;
              auVar35._16_4_ = 0x34000000;
              auVar35._20_4_ = 0x34000000;
              auVar35._24_4_ = 0x34000000;
              auVar35._28_4_ = 0x34000000;
              auVar35 = vmulps_avx512vl(local_a20,auVar35);
              auVar38 = vminps_avx512vl(local_9c0,local_9a0);
              auVar51 = vminps_avx512vl(auVar38,auVar53);
              auVar38._8_4_ = 0x80000000;
              auVar38._0_8_ = 0x8000000080000000;
              auVar38._12_4_ = 0x80000000;
              auVar38._16_4_ = 0x80000000;
              auVar38._20_4_ = 0x80000000;
              auVar38._24_4_ = 0x80000000;
              auVar38._28_4_ = 0x80000000;
              auVar38 = vxorps_avx512vl(auVar35,auVar38);
              uVar12 = vcmpps_avx512vl(auVar51,auVar38,5);
              auVar38 = vmaxps_avx512vl(local_9c0,local_9a0);
              auVar38 = vmaxps_avx512vl(auVar38,auVar53);
              uVar13 = vcmpps_avx512vl(auVar38,auVar35,2);
              local_900 = (byte)uVar12 | (byte)uVar13;
              auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              fVar67 = fStack_b0c;
              fVar68 = fStack_b08;
              fVar69 = fStack_b04;
              fVar58 = local_b10;
              if (local_900 == 0) {
LAB_00714b18:
                auVar70 = ZEXT1664(local_b20);
                auVar72 = ZEXT1664(local_b30);
                auVar63 = ZEXT1664(local_b40);
                auVar65 = ZEXT1664(local_b50);
              }
              else {
                auVar38 = vmulps_avx512vl(auVar34,auVar46);
                auVar53 = vmulps_avx512vl(auVar43,auVar47);
                auVar51 = vmulps_avx512vl(auVar44,auVar45);
                auVar39 = vmulps_avx512vl(auVar47,auVar49);
                auVar40 = vmulps_avx512vl(auVar45,auVar50);
                auVar41 = vmulps_avx512vl(auVar46,auVar48);
                auVar42 = vfmsub213ps_avx512vl(auVar44,auVar47,auVar38);
                auVar34 = vfmsub213ps_avx512vl(auVar34,auVar45,auVar53);
                auVar43 = vfmsub213ps_avx512vl(auVar43,auVar46,auVar51);
                auVar44 = vfmsub213ps_avx512vl(auVar50,auVar46,auVar39);
                auVar46 = vfmsub213ps_avx512vl(auVar48,auVar47,auVar40);
                auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar41);
                vandps_avx512vl(auVar38,local_a20);
                vandps_avx512vl(auVar39,local_a20);
                uVar19 = vcmpps_avx512vl(auVar45,auVar45,1);
                vandps_avx512vl(auVar53,local_a20);
                vandps_avx512vl(auVar40,local_a20);
                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                uVar14 = vcmpps_avx512vl(auVar45,auVar45,1);
                vandps_avx512vl(auVar51,local_a20);
                vandps_avx512vl(auVar41,local_a20);
                uVar15 = vcmpps_avx512vl(auVar38,auVar38,1);
                bVar11 = (bool)((byte)uVar19 & 1);
                local_960._0_4_ =
                     (float)((uint)bVar11 * auVar42._0_4_ | (uint)!bVar11 * auVar44._0_4_);
                bVar11 = (bool)((byte)(uVar19 >> 1) & 1);
                local_960._4_4_ =
                     (float)((uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar44._4_4_);
                bVar11 = (bool)((byte)(uVar19 >> 2) & 1);
                local_960._8_4_ =
                     (float)((uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar44._8_4_);
                bVar11 = (bool)((byte)(uVar19 >> 3) & 1);
                local_960._12_4_ =
                     (float)((uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar44._12_4_);
                bVar11 = (bool)((byte)(uVar19 >> 4) & 1);
                local_960._16_4_ =
                     (float)((uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar44._16_4_);
                bVar11 = (bool)((byte)(uVar19 >> 5) & 1);
                local_960._20_4_ =
                     (float)((uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar44._20_4_);
                bVar11 = (bool)((byte)(uVar19 >> 6) & 1);
                local_960._24_4_ =
                     (float)((uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar44._24_4_);
                bVar11 = SUB81(uVar19 >> 7,0);
                local_960._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar44._28_4_;
                bVar11 = (bool)((byte)uVar14 & 1);
                local_940._0_4_ =
                     (float)((uint)bVar11 * auVar34._0_4_ | (uint)!bVar11 * auVar46._0_4_);
                bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
                local_940._4_4_ =
                     (float)((uint)bVar11 * auVar34._4_4_ | (uint)!bVar11 * auVar46._4_4_);
                bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
                local_940._8_4_ =
                     (float)((uint)bVar11 * auVar34._8_4_ | (uint)!bVar11 * auVar46._8_4_);
                bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
                local_940._12_4_ =
                     (float)((uint)bVar11 * auVar34._12_4_ | (uint)!bVar11 * auVar46._12_4_);
                bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
                local_940._16_4_ =
                     (float)((uint)bVar11 * auVar34._16_4_ | (uint)!bVar11 * auVar46._16_4_);
                bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
                local_940._20_4_ =
                     (float)((uint)bVar11 * auVar34._20_4_ | (uint)!bVar11 * auVar46._20_4_);
                bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
                local_940._24_4_ =
                     (float)((uint)bVar11 * auVar34._24_4_ | (uint)!bVar11 * auVar46._24_4_);
                bVar11 = SUB81(uVar14 >> 7,0);
                local_940._28_4_ = (uint)bVar11 * auVar34._28_4_ | (uint)!bVar11 * auVar46._28_4_;
                bVar11 = (bool)((byte)uVar15 & 1);
                local_920._0_4_ =
                     (float)((uint)bVar11 * auVar43._0_4_ | (uint)!bVar11 * auVar45._0_4_);
                bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
                local_920._4_4_ =
                     (float)((uint)bVar11 * auVar43._4_4_ | (uint)!bVar11 * auVar45._4_4_);
                bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
                local_920._8_4_ =
                     (float)((uint)bVar11 * auVar43._8_4_ | (uint)!bVar11 * auVar45._8_4_);
                bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
                local_920._12_4_ =
                     (float)((uint)bVar11 * auVar43._12_4_ | (uint)!bVar11 * auVar45._12_4_);
                bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
                local_920._16_4_ =
                     (float)((uint)bVar11 * auVar43._16_4_ | (uint)!bVar11 * auVar45._16_4_);
                bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
                local_920._20_4_ =
                     (float)((uint)bVar11 * auVar43._20_4_ | (uint)!bVar11 * auVar45._20_4_);
                bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
                local_920._24_4_ =
                     (float)((uint)bVar11 * auVar43._24_4_ | (uint)!bVar11 * auVar45._24_4_);
                bVar11 = SUB81(uVar15 >> 7,0);
                local_920._28_4_ = (uint)bVar11 * auVar43._28_4_ | (uint)!bVar11 * auVar45._28_4_;
                auVar48._4_4_ = fVar7 * local_920._4_4_;
                auVar48._0_4_ = fVar7 * local_920._0_4_;
                auVar48._8_4_ = fVar7 * local_920._8_4_;
                auVar48._12_4_ = fVar7 * local_920._12_4_;
                auVar48._16_4_ = fVar7 * local_920._16_4_;
                auVar48._20_4_ = fVar7 * local_920._20_4_;
                auVar48._24_4_ = fVar7 * local_920._24_4_;
                auVar48._28_4_ = fVar7;
                auVar28 = vfmadd213ps_fma(auVar66,local_940,auVar48);
                auVar28 = vfmadd213ps_fma(auVar64,local_960,ZEXT1632(auVar28));
                auVar53 = ZEXT1632(CONCAT412(auVar28._12_4_ + auVar28._12_4_,
                                             CONCAT48(auVar28._8_4_ + auVar28._8_4_,
                                                      CONCAT44(auVar28._4_4_ + auVar28._4_4_,
                                                               auVar28._0_4_ + auVar28._0_4_))));
                auVar49._0_4_ = auVar37._0_4_ * local_920._0_4_;
                auVar49._4_4_ = auVar37._4_4_ * local_920._4_4_;
                auVar49._8_4_ = auVar37._8_4_ * local_920._8_4_;
                auVar49._12_4_ = auVar37._12_4_ * local_920._12_4_;
                auVar49._16_4_ = auVar37._16_4_ * local_920._16_4_;
                auVar49._20_4_ = auVar37._20_4_ * local_920._20_4_;
                auVar49._24_4_ = auVar37._24_4_ * local_920._24_4_;
                auVar49._28_4_ = 0;
                auVar28 = vfmadd213ps_fma(auVar36,local_940,auVar49);
                auVar33 = vfmadd213ps_fma(auVar56,local_960,ZEXT1632(auVar28));
                auVar56 = vrcp14ps_avx512vl(auVar53);
                auVar34 = vfnmadd213ps_avx512vl(auVar56,auVar53,auVar35);
                auVar28 = vfmadd132ps_fma(auVar34,auVar56,auVar56);
                local_8a0 = ZEXT1632(CONCAT412((auVar33._12_4_ + auVar33._12_4_) * auVar28._12_4_,
                                               CONCAT48((auVar33._8_4_ + auVar33._8_4_) *
                                                        auVar28._8_4_,
                                                        CONCAT44((auVar33._4_4_ + auVar33._4_4_) *
                                                                 auVar28._4_4_,
                                                                 (auVar33._0_4_ + auVar33._0_4_) *
                                                                 auVar28._0_4_))));
                uVar61 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar34._4_4_ = uVar61;
                auVar34._0_4_ = uVar61;
                auVar34._8_4_ = uVar61;
                auVar34._12_4_ = uVar61;
                auVar34._16_4_ = uVar61;
                auVar34._20_4_ = uVar61;
                auVar34._24_4_ = uVar61;
                auVar34._28_4_ = uVar61;
                uVar12 = vcmpps_avx512vl(local_8a0,auVar34,0xd);
                auVar56 = vxorps_avx512vl(auVar53,auVar38);
                fVar7 = ray->tfar;
                auVar47._4_4_ = fVar7;
                auVar47._0_4_ = fVar7;
                auVar47._8_4_ = fVar7;
                auVar47._12_4_ = fVar7;
                auVar47._16_4_ = fVar7;
                auVar47._20_4_ = fVar7;
                auVar47._24_4_ = fVar7;
                auVar47._28_4_ = fVar7;
                uVar13 = vcmpps_avx512vl(local_8a0,auVar47,2);
                uVar16 = vcmpps_avx512vl(auVar53,auVar56,4);
                local_900 = (byte)uVar12 & (byte)uVar13 & (byte)uVar16 & local_900;
                if (local_900 == 0) goto LAB_00714b18;
                local_820 = 0xf0;
                local_ae8 = context->scene;
                auVar50._8_4_ = 0x219392ef;
                auVar50._0_8_ = 0x219392ef219392ef;
                auVar50._12_4_ = 0x219392ef;
                auVar50._16_4_ = 0x219392ef;
                auVar50._20_4_ = 0x219392ef;
                auVar50._24_4_ = 0x219392ef;
                auVar50._28_4_ = 0x219392ef;
                uVar25 = vcmpps_avx512vl(local_a20,auVar50,5);
                auVar56 = vrcp14ps_avx512vl(local_980);
                auVar34 = vfnmadd213ps_avx512vl(local_980,auVar56,auVar35);
                auVar34 = vfmadd132ps_avx512vl(auVar34,auVar56,auVar56);
                fVar1 = (float)((uint)((byte)uVar25 & 1) * auVar34._0_4_);
                fVar7 = (float)((uint)((byte)(uVar25 >> 1) & 1) * auVar34._4_4_);
                fVar2 = (float)((uint)((byte)(uVar25 >> 2) & 1) * auVar34._8_4_);
                fVar3 = (float)((uint)((byte)(uVar25 >> 3) & 1) * auVar34._12_4_);
                fVar4 = (float)((uint)((byte)(uVar25 >> 4) & 1) * auVar34._16_4_);
                fVar5 = (float)((uint)((byte)(uVar25 >> 5) & 1) * auVar34._20_4_);
                fVar6 = (float)((uint)((byte)(uVar25 >> 6) & 1) * auVar34._24_4_);
                auVar55._4_4_ = fVar7 * local_9c0._4_4_;
                auVar55._0_4_ = fVar1 * local_9c0._0_4_;
                auVar55._8_4_ = fVar2 * local_9c0._8_4_;
                auVar55._12_4_ = fVar3 * local_9c0._12_4_;
                auVar55._16_4_ = fVar4 * local_9c0._16_4_;
                auVar55._20_4_ = fVar5 * local_9c0._20_4_;
                auVar55._24_4_ = fVar6 * local_9c0._24_4_;
                auVar55._28_4_ = local_9c0._28_4_;
                auVar34 = vminps_avx512vl(auVar55,auVar35);
                auVar17._4_4_ = local_9a0._4_4_ * fVar7;
                auVar17._0_4_ = local_9a0._0_4_ * fVar1;
                auVar17._8_4_ = local_9a0._8_4_ * fVar2;
                auVar17._12_4_ = local_9a0._12_4_ * fVar3;
                auVar17._16_4_ = local_9a0._16_4_ * fVar4;
                auVar17._20_4_ = local_9a0._20_4_ * fVar5;
                auVar17._24_4_ = local_9a0._24_4_ * fVar6;
                auVar17._28_4_ = auVar56._28_4_;
                auVar56 = vminps_avx512vl(auVar17,auVar35);
                auVar38 = vsubps_avx512vl(auVar35,auVar34);
                auVar35 = vsubps_avx512vl(auVar35,auVar56);
                local_8c0 = vblendps_avx(auVar56,auVar38,0xf0);
                local_8e0 = vblendps_avx(auVar34,auVar35,0xf0);
                fVar7 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                local_880._4_4_ = local_960._4_4_ * fVar6;
                local_880._0_4_ = local_960._0_4_ * fVar7;
                fVar5 = DAT_02060940._8_4_;
                local_880._8_4_ = local_960._8_4_ * fVar5;
                fVar4 = DAT_02060940._12_4_;
                local_880._12_4_ = local_960._12_4_ * fVar4;
                fVar3 = DAT_02060940._16_4_;
                local_880._16_4_ = local_960._16_4_ * fVar3;
                fVar2 = DAT_02060940._20_4_;
                local_880._20_4_ = local_960._20_4_ * fVar2;
                fVar1 = DAT_02060940._24_4_;
                local_880._24_4_ = local_960._24_4_ * fVar1;
                local_880._28_4_ = local_960._28_4_;
                local_860._4_4_ = local_940._4_4_ * fVar6;
                local_860._0_4_ = local_940._0_4_ * fVar7;
                local_860._8_4_ = local_940._8_4_ * fVar5;
                local_860._12_4_ = local_940._12_4_ * fVar4;
                local_860._16_4_ = local_940._16_4_ * fVar3;
                local_860._20_4_ = local_940._20_4_ * fVar2;
                local_860._24_4_ = local_940._24_4_ * fVar1;
                local_860._28_4_ = local_940._28_4_;
                local_840._4_4_ = local_920._4_4_ * fVar6;
                local_840._0_4_ = local_920._0_4_ * fVar7;
                local_840._8_4_ = local_920._8_4_ * fVar5;
                local_840._12_4_ = local_920._12_4_ * fVar4;
                local_840._16_4_ = local_920._16_4_ * fVar3;
                local_840._20_4_ = local_920._20_4_ * fVar2;
                local_840._24_4_ = local_920._24_4_ * fVar1;
                local_840._28_4_ = local_920._28_4_;
                uVar19 = (ulong)local_900;
                auVar70 = ZEXT1664(local_b20);
                auVar72 = ZEXT1664(local_b30);
                auVar63 = ZEXT1664(local_b40);
                auVar65 = ZEXT1664(local_b50);
                do {
                  uVar25 = 0;
                  for (uVar26 = uVar19; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000
                      ) {
                    uVar25 = uVar25 + 1;
                  }
                  local_ac8 = *(uint *)((long)&local_9e0 + uVar25 * 4);
                  pGVar9 = (local_ae8->geometries).items[local_ac8].ptr;
                  if ((pGVar9->mask & ray->mask) == 0) {
                    uVar19 = uVar19 ^ 1L << (uVar25 & 0x3f);
                    bVar11 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar11 = false;
                    }
                    else {
                      local_a20._0_8_ = uVar24;
                      uVar24 = (ulong)(uint)((int)uVar25 * 4);
                      local_ad4 = *(undefined4 *)(local_8e0 + uVar24);
                      local_ad0 = *(undefined4 *)(local_8c0 + uVar24);
                      local_ab0.context = context->user;
                      local_acc = *(undefined4 *)((long)&local_a00 + uVar24);
                      local_ae0 = *(undefined4 *)(local_880 + uVar24);
                      local_adc = *(undefined4 *)(local_860 + uVar24);
                      local_ad8 = *(undefined4 *)(local_840 + uVar24);
                      local_ac4 = (local_ab0.context)->instID[0];
                      local_ac0 = (local_ab0.context)->instPrimID[0];
                      fVar7 = ray->tfar;
                      ray->tfar = *(float *)(local_8a0 + uVar24);
                      local_b84 = -1;
                      local_ab0.valid = &local_b84;
                      local_ab0.geometryUserPtr = pGVar9->userPtr;
                      local_ab0.hit = (RTCHitN *)&local_ae0;
                      local_ab0.N = 1;
                      local_a30 = auVar73._0_16_;
                      local_a40 = auVar74._0_16_;
                      local_a50 = auVar75._0_16_;
                      local_a60 = auVar76._0_16_;
                      local_a70 = auVar77._0_16_;
                      local_a80 = auVar78._0_16_;
                      local_ab0.ray = (RTCRayN *)ray;
                      if (pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00714a22:
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar9->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_ab0);
                            auVar65 = ZEXT1664(local_b50);
                            auVar63 = ZEXT1664(local_b40);
                            auVar72 = ZEXT1664(local_b30);
                            auVar70 = ZEXT1664(local_b20);
                            auVar78 = ZEXT1664(local_a80);
                            auVar77 = ZEXT1664(local_a70);
                            auVar76 = ZEXT1664(local_a60);
                            auVar75 = ZEXT1664(local_a50);
                            auVar74 = ZEXT1664(local_a40);
                            auVar73 = ZEXT1664(local_a30);
                            fVar58 = local_b10;
                            fVar67 = fStack_b0c;
                            fVar68 = fStack_b08;
                            fVar69 = fStack_b04;
                          }
                          if (*local_ab0.valid == 0) goto LAB_00714ac9;
                        }
                        bVar11 = false;
                      }
                      else {
                        local_b00 = ray;
                        local_af8 = context;
                        (*pGVar9->occlusionFilterN)(&local_ab0);
                        auVar65 = ZEXT1664(local_b50);
                        auVar63 = ZEXT1664(local_b40);
                        auVar72 = ZEXT1664(local_b30);
                        auVar70 = ZEXT1664(local_b20);
                        auVar78 = ZEXT1664(local_a80);
                        auVar77 = ZEXT1664(local_a70);
                        auVar76 = ZEXT1664(local_a60);
                        auVar75 = ZEXT1664(local_a50);
                        auVar74 = ZEXT1664(local_a40);
                        auVar73 = ZEXT1664(local_a30);
                        context = local_af8;
                        ray = local_b00;
                        fVar58 = local_b10;
                        fVar67 = fStack_b0c;
                        fVar68 = fStack_b08;
                        fVar69 = fStack_b04;
                        if (*local_ab0.valid != 0) goto LAB_00714a22;
LAB_00714ac9:
                        ray->tfar = fVar7;
                        uVar19 = uVar19 ^ 1L << (uVar25 & 0x3f);
                        bVar11 = true;
                      }
                      uVar24 = local_a20._0_8_;
                    }
                  }
                  uVar25 = local_b58;
                  uVar26 = local_b60;
                  if (!bVar11) {
                    iVar18 = 0;
                    if (bVar27) {
                      ray->tfar = -INFINITY;
                      iVar18 = 3;
                    }
                    goto LAB_00714b66;
                  }
                } while (uVar19 != 0);
              }
              iVar18 = 0;
              uVar22 = uVar22 + 1;
              bVar27 = uVar22 < local_af0;
            } while (uVar22 != local_af0);
          }
        }
LAB_00714b66:
      } while (iVar18 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }